

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_header_table_attach(lws *wsi,int autoservice)

{
  lws_context *plVar1;
  char *pcVar2;
  allocated_headers *paVar3;
  lws *plVar4;
  undefined1 local_3c [4];
  int n;
  lws_pollargs pa;
  lws_context_per_thread *pt;
  lws_context *context;
  int autoservice_local;
  lws *wsi_local;
  
  plVar1 = (wsi->a).context;
  pa._4_8_ = plVar1->pt + (int)wsi->tsi;
  pcVar2 = lws_wsi_tag(wsi);
  _lws_log(8,"%s: %s: ah %p (tsi %d, count = %d) in\n","lws_header_table_attach",pcVar2,
           (wsi->http).ah,(ulong)(uint)(int)wsi->tsi,*(undefined4 *)(pa._4_8_ + 0x170));
  if ((wsi->role_ops != &role_ops_h1) && (wsi->role_ops != &role_ops_h2)) {
    _lws_log(1,"%s: bad role %s\n","lws_header_table_attach",wsi->role_ops->name);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0xe1,"int lws_header_table_attach(struct lws *, int)");
  }
  if ((wsi->http).ah == (allocated_headers *)0x0) {
    if (*(uint *)(pa._4_8_ + 0x170) == plVar1->max_http_header_pool) {
      _lws_header_ensure_we_are_on_waiting_list(wsi);
    }
    else {
      __lws_remove_from_ah_waiting_list(wsi);
      paVar3 = _lws_create_ah((lws_context_per_thread *)pa._4_8_,plVar1->max_http_header_data);
      (wsi->http).ah = paVar3;
      if ((wsi->http).ah != (allocated_headers *)0x0) {
        ((wsi->http).ah)->in_use = '\x01';
        ((wsi->http).ah)->wsi = wsi;
        *(int *)(pa._4_8_ + 0x170) = *(int *)(pa._4_8_ + 0x170) + 1;
        _lws_change_pollfd(wsi,0,1,(lws_pollargs *)local_3c);
        pcVar2 = lws_wsi_tag(wsi);
        _lws_log(8,"%s: did attach wsi %s: ah %p: count %d (on exit)\n","lws_header_table_attach",
                 pcVar2,(wsi->http).ah,(ulong)*(uint *)(pa._4_8_ + 0x170));
        goto LAB_001242c2;
      }
      _lws_header_ensure_we_are_on_waiting_list(wsi);
    }
    wsi_local._4_4_ = 1;
  }
  else {
    _lws_log(8,"%s: cleardown\n","lws_header_table_attach");
LAB_001242c2:
    __lws_header_table_reset(wsi,autoservice);
    if ((((wsi->wsistate & 0x10000000) == 0) || ((wsi->wsistate & 0xffff) != 0x200)) ||
       (plVar4 = lws_http_client_connect_via_info2(wsi), plVar4 != (lws *)0x0)) {
      wsi_local._4_4_ = 0;
    }
    else {
      wsi_local._4_4_ = -1;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int LWS_WARN_UNUSED_RESULT
lws_header_table_attach(struct lws *wsi, int autoservice)
{
	struct lws_context *context = wsi->a.context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	struct lws_pollargs pa;
	int n;

#if defined(LWS_ROLE_MQTT) && defined(LWS_WITH_CLIENT)
	if (lwsi_role_mqtt(wsi))
		goto connect_via_info2;
#endif

	lwsl_info("%s: %s: ah %p (tsi %d, count = %d) in\n", __func__,
		  lws_wsi_tag(wsi), (void *)wsi->http.ah, wsi->tsi,
		  pt->http.ah_count_in_use);

	if (!lwsi_role_http(wsi)) {
		lwsl_err("%s: bad role %s\n", __func__, wsi->role_ops->name);
		assert(0);
		return -1;
	}

	lws_pt_lock(pt, __func__);

	/* if we are already bound to one, just clear it down */
	if (wsi->http.ah) {
		lwsl_info("%s: cleardown\n", __func__);
		goto reset;
	}

	n = pt->http.ah_count_in_use == (int)context->max_http_header_pool;
#if defined(LWS_WITH_PEER_LIMITS)
	if (!n)
		n = lws_peer_confirm_ah_attach_ok(context, wsi->peer);
#endif
	if (n) {
		/*
		 * Pool is either all busy, or we don't want to give this
		 * particular guy an ah right now...
		 *
		 * Make sure we are on the waiting list, and return that we
		 * weren't able to provide the ah
		 */
		_lws_header_ensure_we_are_on_waiting_list(wsi);

		goto bail;
	}

	__lws_remove_from_ah_waiting_list(wsi);

	wsi->http.ah = _lws_create_ah(pt, context->max_http_header_data);
	if (!wsi->http.ah) { /* we could not create an ah */
		_lws_header_ensure_we_are_on_waiting_list(wsi);

		goto bail;
	}

	wsi->http.ah->in_use = 1;
	wsi->http.ah->wsi = wsi; /* mark our owner */
	pt->http.ah_count_in_use++;

#if defined(LWS_WITH_PEER_LIMITS) && (defined(LWS_ROLE_H1) || \
    defined(LWS_ROLE_H2))
	lws_context_lock(context, "ah attach"); /* <========================= */
	if (wsi->peer)
		wsi->peer->http.count_ah++;
	lws_context_unlock(context); /* ====================================> */
#endif

	_lws_change_pollfd(wsi, 0, LWS_POLLIN, &pa);

	lwsl_info("%s: did attach wsi %s: ah %p: count %d (on exit)\n", __func__,
		  lws_wsi_tag(wsi), (void *)wsi->http.ah, pt->http.ah_count_in_use);

reset:
	__lws_header_table_reset(wsi, autoservice);

	lws_pt_unlock(pt);

#if defined(LWS_WITH_CLIENT)
#if defined(LWS_ROLE_MQTT)
connect_via_info2:
#endif
	if (lwsi_role_client(wsi) && lwsi_state(wsi) == LRS_UNCONNECTED)
		if (!lws_http_client_connect_via_info2(wsi))
			/* our client connect has failed, the wsi
			 * has been closed
			 */
			return -1;
#endif

	return 0;

bail:
	lws_pt_unlock(pt);

	return 1;
}